

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu.cxx
# Opt level: O2

void __thiscall
menuwindow::menuwindow
          (menuwindow *this,Fl_Menu_Item *m,int X,int Y,int Wp,int Hp,Fl_Menu_Item *picked,
          Fl_Menu_Item *t,int menubar,int menubar_title,int right_edge)

{
  uint *puVar1;
  byte *pbVar2;
  uchar *buf;
  Fl_Single_Window *pFVar3;
  Fl_Menu_ *m_00;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  Fl_Menu_Item *m1;
  Fl_Menu_Item *pFVar9;
  Fl_Menu_Item *pFVar10;
  char *c;
  size_t sVar11;
  menutitle *this_00;
  byte bVar12;
  int iVar13;
  undefined4 in_register_0000000c;
  Fl_Color FVar14;
  uint uVar15;
  Fl_Boxtype t_00;
  undefined4 in_register_0000008c;
  int iVar16;
  int iVar17;
  double extraout_XMM0_Qa;
  double dVar18;
  int local_70;
  int Htitle;
  undefined8 local_68;
  undefined8 local_60;
  char *k;
  int hh;
  int scr_h;
  int scr_w;
  int scr_y;
  int scr_x;
  double local_38;
  
  local_60 = CONCAT44(in_register_0000008c,Hp);
  local_68 = CONCAT44(in_register_0000000c,Y);
  Fl_Menu_Window::Fl_Menu_Window(&this->super_Fl_Menu_Window,X,Y,Wp,Hp,(char *)0x0);
  (this->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.super_Fl_Group.super_Fl_Widget
  ._vptr_Fl_Widget = (_func_int **)&PTR__menuwindow_002787b0;
  Fl::screen_work_area(&scr_x,&scr_y,&scr_w,&scr_h);
  Fl_Group::end((Fl_Group *)this);
  puVar1 = &(this->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.super_Fl_Group.
            super_Fl_Widget.flags_;
  *puVar1 = *puVar1 | 0x5008;
  this->menu = m;
  if (m == (Fl_Menu_Item *)0x0) {
    pFVar9 = (Fl_Menu_Item *)0x0;
  }
  else {
    pFVar9 = Fl_Menu_Item::first(m);
  }
  this->drawn_selected = -1;
  m_00 = button;
  FVar14 = 0x31;
  if (button == (Fl_Menu_ *)0x0) {
    (this->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.super_Fl_Group.
    super_Fl_Widget.box_ = '\x02';
  }
  else {
    bVar12 = (button->super_Fl_Widget).box_;
    if (bVar12 < 3) {
      bVar12 = 2;
    }
    (this->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.super_Fl_Group.
    super_Fl_Widget.box_ = bVar12;
    if (Fl::scheme_ == (char *)0x0) {
      FVar14 = (m_00->super_Fl_Widget).color_;
    }
  }
  (this->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.super_Fl_Group.super_Fl_Widget
  .color_ = FVar14;
  this->selected = -1;
  local_70 = Wp;
  if (pFVar9 == (Fl_Menu_Item *)0x0) {
    iVar16 = 0;
LAB_001bb8c2:
    this->numitems = iVar16;
    if (menubar == 0) {
      this->itemheight = 1;
      Htitle = 0;
      iVar16 = 0;
      iVar4 = 0;
      if (t != (Fl_Menu_Item *)0x0) {
        iVar4 = Fl_Menu_Item::measure(t,&Htitle,m_00);
        iVar4 = iVar4 + 0xc;
      }
      iVar13 = 0;
      uVar8 = 0;
      if (pFVar9 != (Fl_Menu_Item *)0x0) {
        iVar16 = 0;
        iVar13 = 0;
        uVar8 = 0;
        for (pFVar10 = pFVar9; pFVar10->text != (char *)0x0; pFVar10 = Fl_Menu_Item::next(pFVar10,1)
            ) {
          iVar5 = Fl_Menu_Item::measure(pFVar10,&hh,button);
          if (this->itemheight < hh + 4) {
            this->itemheight = hh + 4;
          }
          iVar6 = 0;
          if ((pFVar10->flags & 0x60) != 0) {
            iVar6 = FL_NORMAL_SIZE;
          }
          if ((int)uVar8 < iVar6 + iVar5) {
            uVar8 = iVar6 + iVar5;
          }
          iVar5 = iVar13;
          if (pFVar10->shortcut_ != 0) {
            c = fl_shortcut_label(pFVar10->shortcut_,&k);
            buf = (uchar *)CONCAT44(k._4_4_,(int)k);
            sVar11 = strlen((char *)buf);
            iVar5 = fl_utf_nb_char(buf,(int)sVar11);
            if (iVar5 < 5) {
              (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x37])
                        (fl_graphics_driver,c,(ulong)(uint)((int)k - (int)c));
              local_38 = extraout_XMM0_Qa;
              dVar18 = fl_width((char *)CONCAT44(k._4_4_,(int)k));
              if (iVar13 <= (int)local_38) {
                iVar13 = (int)local_38;
              }
              iVar5 = iVar13;
              if (iVar16 < (int)dVar18 + 4) {
                iVar16 = (int)dVar18 + 4;
              }
            }
            else {
              dVar18 = fl_width(c);
              iVar5 = ((int)dVar18 + 4) - iVar16;
              if ((int)dVar18 + 4 <= iVar16 + iVar13) {
                iVar5 = iVar13;
              }
            }
          }
          iVar13 = iVar5;
          if (((pFVar10->labelcolor_ != 0) || (Fl::scheme_ != (char *)0x0)) ||
             (1 < pFVar10->labeltype_)) {
            pbVar2 = (byte *)((long)&(this->super_Fl_Menu_Window).super_Fl_Single_Window.
                                     super_Fl_Window.super_Fl_Group.super_Fl_Widget.flags_ + 1);
            *pbVar2 = *pbVar2 | 0x80;
          }
        }
      }
      this->shortcutWidth = iVar16;
      iVar5 = this->selected;
      iVar6 = Fl::box_dx((uint)(this->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.
                               super_Fl_Group.super_Fl_Widget.box_);
      uVar15 = uVar8 >> 1;
      if (local_70 != 0) {
        uVar15 = 0;
      }
      if (iVar5 < 0) {
        uVar15 = 0;
      }
      iVar16 = iVar16 + iVar13 + uVar8 + iVar6 * 2 + 7;
      if (iVar16 < local_70) {
        iVar16 = local_70;
      }
      if (iVar16 < iVar4) {
        iVar16 = iVar4;
      }
      iVar13 = X - uVar15;
      if ((int)(X - uVar15) <= scr_x) {
        iVar13 = scr_x;
      }
      iVar5 = (scr_x - iVar16) + scr_w;
      if (iVar13 < iVar5) {
        iVar5 = iVar13;
      }
      (this->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.super_Fl_Group.
      super_Fl_Widget.x_ = iVar5;
      (this->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.super_Fl_Group.
      super_Fl_Widget.w_ = iVar16;
      iVar16 = this->itemheight;
      iVar13 = iVar16 * this->numitems + -4;
      if (this->numitems == 0) {
        iVar13 = 0;
      }
      iVar13 = iVar13 + iVar6 * 2 + 3;
      (this->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.super_Fl_Group.
      super_Fl_Widget.h_ = iVar13;
      if (this->selected < 0) {
        iVar17 = (int)local_60 + (int)local_68;
        if ((scr_h + scr_y < iVar13 + iVar17) && (scr_y <= iVar17 - iVar13)) {
          if ((int)local_60 < 2) {
            t_00 = (Fl_Boxtype)
                   (this->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.
                   super_Fl_Group.super_Fl_Widget.box_;
            if (t == (Fl_Menu_Item *)0x0) {
              iVar7 = Fl::box_dy(t_00);
              iVar17 = (iVar17 - iVar13) + iVar16 + iVar7;
            }
            else {
              iVar7 = Fl::box_dh(t_00);
              iVar17 = iVar17 - (iVar16 + iVar13 + iVar7);
            }
          }
          else {
            iVar17 = (int)local_68 - iVar13;
          }
        }
      }
      else {
        iVar17 = (((int)local_60 - iVar16) / 2 + (int)local_68) - (iVar6 + this->selected * iVar16);
      }
      iVar13 = Htitle;
      iVar16 = iVar17;
      if (pFVar9 == (Fl_Menu_Item *)0x0) {
        iVar16 = iVar17 + -2;
        pFVar3 = &(this->super_Fl_Menu_Window).super_Fl_Single_Window;
        (pFVar3->super_Fl_Window).super_Fl_Group.super_Fl_Widget.w_ = 1;
        (pFVar3->super_Fl_Window).super_Fl_Group.super_Fl_Widget.h_ = 1;
      }
      (this->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.super_Fl_Group.
      super_Fl_Widget.y_ = iVar16;
      if (t == (Fl_Menu_Item *)0x0) {
        this_00 = (menutitle *)0x0;
      }
      else if (menubar_title == 0) {
        this_00 = (menutitle *)operator_new(0xf8);
        iVar13 = iVar6 * 2 + 3 + iVar13;
        menutitle::menutitle(this_00,iVar5,(iVar17 - iVar13) + -2,iVar4,iVar13,t);
      }
      else {
        uVar8 = Fl::box_dy((uint)(button->super_Fl_Widget).box_);
        iVar16 = (button->super_Fl_Widget).h_;
        this_00 = (menutitle *)operator_new(0xf8);
        iVar16 = iVar16 + uVar8 * -2 + -2;
        menutitle::menutitle(this_00,X,(~uVar8 + (int)local_68) - iVar16,iVar4,iVar16,t);
      }
      this->title = this_00;
    }
    else {
      this->itemheight = 0;
      this->title = (menutitle *)0x0;
    }
    return;
  }
  iVar16 = 0;
  pFVar10 = pFVar9;
  do {
    if (picked == (Fl_Menu_Item *)0x0) {
LAB_001bb89a:
      picked = (Fl_Menu_Item *)0x0;
    }
    else {
      iVar4 = iVar16;
      if (pFVar10 == picked) {
LAB_001bb894:
        this->selected = iVar4;
        goto LAB_001bb89a;
      }
      if (picked < pFVar10) {
        local_60 = 0;
        local_70 = 0;
        iVar4 = iVar16 + -1;
        goto LAB_001bb894;
      }
    }
    if (pFVar10->text == (char *)0x0) goto LAB_001bb8c2;
    pFVar10 = Fl_Menu_Item::next(pFVar10,1);
    iVar16 = iVar16 + 1;
  } while( true );
}

Assistant:

menuwindow::menuwindow(const Fl_Menu_Item* m, int X, int Y, int Wp, int Hp,
		       const Fl_Menu_Item* picked, const Fl_Menu_Item* t, 
		       int menubar, int menubar_title, int right_edge)
  : Fl_Menu_Window(X, Y, Wp, Hp, 0)
{
  int scr_x, scr_y, scr_w, scr_h;
  int tx = X, ty = Y;

  Fl::screen_work_area(scr_x, scr_y, scr_w, scr_h);
  if (!right_edge || right_edge > scr_x+scr_w) right_edge = scr_x+scr_w;

  end();
  set_modal();
  clear_border();
  set_menu_window();
  menu = m;
  if (m) m = m->first(); // find the first item that needs to be rendered
  drawn_selected = -1;
  if (button) {
    box(button->box());
    if (box() == FL_NO_BOX || box() == FL_FLAT_BOX) box(FL_UP_BOX);
  } else {
    box(FL_UP_BOX);
  }
  color(button && !Fl::scheme() ? button->color() : FL_GRAY);
  selected = -1;
  {
    int j = 0;
    if (m) for (const Fl_Menu_Item* m1=m; ; m1 = m1->next(), j++) {
      if (picked) {
        if (m1 == picked) {selected = j; picked = 0;}
        else if (m1 > picked) {selected = j-1; picked = 0; Wp = Hp = 0;}
    }
    if (!m1->text) break;
  }
  numitems = j;}

  if (menubar) {
    itemheight = 0;
    title = 0;
    return;
  }

  itemheight = 1;

  int hotKeysw = 0;
  int hotModsw = 0;
  int Wtitle = 0;
  int Htitle = 0;
  if (t) Wtitle = t->measure(&Htitle, button) + 12;
  int W = 0;
  if (m) for (; m->text; m = m->next()) {
    int hh; 
    int w1 = m->measure(&hh, button);
    if (hh+LEADING>itemheight) itemheight = hh+LEADING;
    if (m->flags&(FL_SUBMENU|FL_SUBMENU_POINTER)) 
      w1 += FL_NORMAL_SIZE;
    if (w1 > W) W = w1;
    // calculate the maximum width of all shortcuts
    if (m->shortcut_) {
      // s is a pointer to the UTF-8 string for the entire shortcut
      // k points only to the key part (minus the modifier keys)
      const char *k, *s = fl_shortcut_label(m->shortcut_, &k);
      if (fl_utf_nb_char((const unsigned char*)k, (int) strlen(k))<=4) {
        // a regular shortcut has a right-justified modifier followed by a left-justified key
        w1 = int(fl_width(s, (int) (k-s)));
        if (w1 > hotModsw) hotModsw = w1;
        w1 = int(fl_width(k))+4;
        if (w1 > hotKeysw) hotKeysw = w1;
      } else {
        // a shortcut with a long modifier is right-justified to the menu
        w1 = int(fl_width(s))+4;
        if (w1 > (hotModsw+hotKeysw)) {
          hotModsw = w1-hotKeysw;
        }
      }
    }
    if (m->labelcolor_ || Fl::scheme() || m->labeltype_ > FL_NO_LABEL) clear_overlay();
  }
  shortcutWidth = hotKeysw;
  if (selected >= 0 && !Wp) X -= W/2;
  int BW = Fl::box_dx(box());
  W += hotKeysw+hotModsw+2*BW+7;
  if (Wp > W) W = Wp;
  if (Wtitle > W) W = Wtitle;

  if (X < scr_x) X = scr_x; 
  // this change improves popup submenu positioning at right screen edge, 
  // but it makes right_edge argument useless
  //if (X > scr_x+scr_w-W) X = right_edge-W;
  if (X > scr_x+scr_w-W) X = scr_x+scr_w-W;
  x(X); w(W);
  h((numitems ? itemheight*numitems-LEADING : 0)+2*BW+3);
  if (selected >= 0) {
    Y = Y+(Hp-itemheight)/2-selected*itemheight-BW;
  } else {
    Y = Y+Hp;
    // if the menu hits the bottom of the screen, we try to draw
    // it above the menubar instead. We will not adjust any menu
    // that has a selected item.
    if (Y+h()>scr_y+scr_h && Y-h()>=scr_y) {
      if (Hp>1) {
        // if we know the height of the Fl_Menu_, use it
        Y = Y-Hp-h();
      } else if (t) {
        // assume that the menubar item height relates to the first
        // menuitem as well
        Y = Y-itemheight-h()-Fl::box_dh(box());
      } else {
        // draw the menu to the right
        Y = Y-h()+itemheight+Fl::box_dy(box());
      }
    }
  }
  if (m) y(Y); else {y(Y-2); w(1); h(1);}

  if (t) {
    if (menubar_title) {
      int dy = Fl::box_dy(button->box())+1;
      int ht = button->h()-dy*2;
      title = new menutitle(tx, ty-ht-dy, Wtitle, ht, t);
    } else {
      int dy = 2;
      int ht = Htitle+2*BW+3;
      title = new menutitle(X, Y-ht-dy, Wtitle, ht, t);
    }
  } else {
    title = 0;
  }
}